

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O2

bool __thiscall FlowGraph::IsUnsignedOpnd(FlowGraph *this,Opnd *src,Opnd **pShrSrc1)

{
  StackSym *this_00;
  Opnd *this_01;
  bool bVar1;
  int32 iVar2;
  RegOpnd *pRVar3;
  Instr *pIVar4;
  
  bVar1 = IR::Opnd::IsRegOpnd(src);
  if (bVar1) {
    pRVar3 = IR::Opnd::AsRegOpnd(src);
    if ((pRVar3->m_sym->field_0x18 & 1) == 0) {
      return false;
    }
    if ((pRVar3->m_sym->field_5).m_instrDef == (Instr *)0x0) {
      return false;
    }
    pRVar3 = IR::Opnd::AsRegOpnd(src);
    bVar1 = StackSym::IsIntConst(pRVar3->m_sym);
    pRVar3 = IR::Opnd::AsRegOpnd(src);
    this_00 = pRVar3->m_sym;
    if (bVar1) {
      iVar2 = StackSym::GetIntConstValue(this_00);
      if (-1 < iVar2) {
LAB_003fe381:
        *pShrSrc1 = src;
        return true;
      }
    }
    else {
      if ((this_00->field_0x18 & 1) == 0) {
        pIVar4 = (Instr *)0x0;
      }
      else {
        pIVar4 = (this_00->field_5).m_instrDef;
      }
      if (pIVar4->m_opcode != ShrU_A) {
        return false;
      }
      this_01 = pIVar4->m_src2;
      bVar1 = IR::Opnd::IsRegOpnd(this_01);
      if (bVar1) {
        pRVar3 = IR::Opnd::AsRegOpnd(this_01);
        bVar1 = StackSym::IsTaggableIntConst(pRVar3->m_sym);
        if (bVar1) {
          pRVar3 = IR::Opnd::AsRegOpnd(this_01);
          iVar2 = StackSym::GetIntConstValue(pRVar3->m_sym);
          if (iVar2 == 0) {
            src = pIVar4->m_src1;
            goto LAB_003fe381;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool FlowGraph::IsUnsignedOpnd(IR::Opnd *src, IR::Opnd **pShrSrc1)
{
    // Look for an unsigned constant, or the result of an unsigned shift by zero
    if (!src->IsRegOpnd())
    {
        return false;
    }
    if (!src->AsRegOpnd()->m_sym->IsSingleDef())
    {
        return false;
    }

    if (src->AsRegOpnd()->m_sym->IsIntConst())
    {
        int32 intConst = src->AsRegOpnd()->m_sym->GetIntConstValue();

        if (intConst >= 0)
        {
            *pShrSrc1 = src;
            return true;
        }
        else
        {
            return false;
        }
    }

    IR::Instr * shrUInstr = src->AsRegOpnd()->m_sym->GetInstrDef();

    if (shrUInstr->m_opcode != Js::OpCode::ShrU_A)
    {
        return false;
    }

    IR::Opnd *shrCnt = shrUInstr->GetSrc2();

    if (!shrCnt->IsRegOpnd() || !shrCnt->AsRegOpnd()->m_sym->IsTaggableIntConst() || shrCnt->AsRegOpnd()->m_sym->GetIntConstValue() != 0)
    {
        return false;
    }

    IR::Opnd *shrSrc = shrUInstr->GetSrc1();

    *pShrSrc1 = shrSrc;
    return true;
}